

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralPointAction::~IfcStructuralPointAction
          (IfcStructuralPointAction *this)

{
  undefined1 *this_00;
  undefined1 *puVar1;
  
  this_00 = &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.
             super_IfcObject.field_0x28;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x28 = 0x9a0378;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x10 = 0x9a0468;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x18 = 0x9a03a0;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xc0 = 0x9a03c8;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.Representation.
    have = 0x9a03f0;
  this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.GlobalOrLocal.field_2.
  _M_allocated_capacity = 0x9a0418;
  *(undefined8 *)&this[-1].super_IfcStructuralAction.field_0x160 = 0x9a0440;
  puVar1 = *(undefined1 **)&this[-1].super_IfcStructuralAction.CausedBy.have;
  if (puVar1 != &this[-1].super_IfcStructuralAction.field_0x180) {
    operator_delete(puVar1);
  }
  IfcStructuralActivity::~IfcStructuralActivity
            ((IfcStructuralActivity *)this_00,&PTR_construction_vtable_24__009a01e8);
  operator_delete(this_00);
  return;
}

Assistant:

IfcStructuralPointAction() : Object("IfcStructuralPointAction") {}